

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.h
# Opt level: O0

uint small_class_calc_size_by_offset(small_class *sc,uint cls)

{
  uint local_1c;
  uint local_18;
  uint log2;
  uint linear_part;
  uint cls_local;
  small_class *sc_local;
  
  local_18 = cls + 1 & sc->effective_mask;
  local_1c = cls + 1 >> ((byte)sc->effective_bits & 0x1f);
  if (local_1c != 0) {
    local_1c = local_1c - 1;
    local_18 = sc->effective_size | local_18;
  }
  return sc->size_shift +
         ((local_18 << ((byte)local_1c & 0x1f)) << ((byte)sc->ignore_bits_count & 0x1f));
}

Assistant:

static inline unsigned
small_class_calc_size_by_offset(struct small_class *sc, unsigned cls)
{
	++cls;
	/* Effective bits (without leading 1) in size */
	unsigned linear_part = cls & sc->effective_mask;
	/* Log2 base part of the size, maybe with leading 1 of the size. */
	unsigned log2 = cls >> sc->effective_bits;
	if (log2 != 0) {
		/* Remove leading 1 from log2 part and add to linear part. */
		log2--;
		linear_part |= sc->effective_size;
	}
	/* Reassemble size and add never significant bits. */
	return sc->size_shift + (linear_part << log2 << sc->ignore_bits_count);
}